

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::VertexIDCase::renderReference
          (VertexIDCase *this,PixelBufferAccess *dst,int numVertices,deUint16 *indices,
          Vec4 *positions,Vec4 *colors)

{
  FragmentShader *local_460;
  VertexAttrib *local_448;
  DrawIndices local_440;
  PrimitiveList local_430;
  Program local_410;
  DrawCommand local_3f8;
  undefined1 local_3c8 [8];
  VertexAttrib attribs [2];
  VertexIDReferenceShader referenceShader;
  MultisamplePixelBufferAccess local_2e0;
  MultisamplePixelBufferAccess local_2b8;
  undefined1 local_290 [8];
  RenderTarget referenceTarget;
  MultisamplePixelBufferAccess local_188;
  MultisampleConstPixelBufferAccess local_160;
  ViewportState local_138;
  undefined1 local_120 [8];
  RenderState referenceState;
  Renderer referenceRenderer;
  Vec4 *colors_local;
  Vec4 *positions_local;
  deUint16 *indices_local;
  int numVertices_local;
  PixelBufferAccess *dst_local;
  VertexIDCase *this_local;
  
  unique0x10000502 = colors;
  rr::Renderer::Renderer((Renderer *)((long)&referenceState.restart.restartIndex + 3));
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&local_188,dst);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_160,&local_188);
  rr::ViewportState::ViewportState(&local_138,&local_160);
  rr::RenderState::RenderState((RenderState *)local_120,&local_138,VIEWPORTORIENTATION_LOWER_LEFT);
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&local_2b8,dst);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_2e0);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)
             &referenceShader.super_FragmentShader.m_outputs.
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  rr::RenderTarget::RenderTarget
            ((RenderTarget *)local_290,&local_2b8,&local_2e0,
             (MultisamplePixelBufferAccess *)
             &referenceShader.super_FragmentShader.m_outputs.
              super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  VertexIDReferenceShader::VertexIDReferenceShader
            ((VertexIDReferenceShader *)((long)&attribs[1].generic.v + 8));
  local_448 = (VertexAttrib *)local_3c8;
  do {
    rr::VertexAttrib::VertexAttrib(local_448);
    local_448 = local_448 + 1;
  } while (local_448 != (VertexAttrib *)((long)&attribs[1].generic.v + 8));
  local_3c8._0_4_ = VERTEXATTRIBTYPE_FLOAT;
  local_3c8._4_4_ = 4;
  attribs[0].type = VERTEXATTRIBTYPE_FLOAT;
  attribs[0].size = 0;
  attribs[0].generic.v.uData[2] = 0;
  attribs[0].generic.v.uData[3] = 4;
  attribs[1].type = VERTEXATTRIBTYPE_FLOAT;
  attribs[1].size = 0;
  attribs[1]._8_8_ = stack0xffffffffffffffc8;
  local_460 = (FragmentShader *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x378) {
    local_460 = (FragmentShader *)
                &referenceShader.super_VertexShader.m_outputs.
                 super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  attribs[0]._8_8_ = positions;
  rr::Program::Program
            (&local_410,(VertexShader *)((long)&attribs[1].generic.v + 8),local_460,
             (GeometryShader *)0x0);
  rr::DrawIndices::DrawIndices(&local_440,indices,0);
  rr::PrimitiveList::PrimitiveList(&local_430,PRIMITIVETYPE_TRIANGLES,numVertices,&local_440);
  rr::DrawCommand::DrawCommand
            (&local_3f8,(RenderState *)local_120,(RenderTarget *)local_290,&local_410,2,
             (VertexAttrib *)local_3c8,&local_430);
  rr::Renderer::draw((Renderer *)((long)&referenceState.restart.restartIndex + 3),&local_3f8);
  VertexIDReferenceShader::~VertexIDReferenceShader
            ((VertexIDReferenceShader *)((long)&attribs[1].generic.v + 8));
  rr::Renderer::~Renderer((Renderer *)((long)&referenceState.restart.restartIndex + 3));
  return;
}

Assistant:

void VertexIDCase::renderReference (const tcu::PixelBufferAccess& dst, const int numVertices, const deUint16* const indices, const tcu::Vec4* const positions, const tcu::Vec4* const colors)
{
	const rr::Renderer				referenceRenderer;
	const rr::RenderState			referenceState		((rr::ViewportState)(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(dst)));
	const rr::RenderTarget			referenceTarget		(rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(dst));
	const VertexIDReferenceShader	referenceShader;
	      rr::VertexAttrib			attribs[2];

	attribs[0].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attribs[0].size				= 4;
	attribs[0].stride			= 0;
	attribs[0].instanceDivisor	= 0;
	attribs[0].pointer			= positions;

	attribs[1].type				= rr::VERTEXATTRIBTYPE_FLOAT;
	attribs[1].size				= 4;
	attribs[1].stride			= 0;
	attribs[1].instanceDivisor	= 0;
	attribs[1].pointer			= colors;

	referenceRenderer.draw(
		rr::DrawCommand(
			referenceState,
			referenceTarget,
			rr::Program(&referenceShader, &referenceShader),
			2,
			attribs,
			rr::PrimitiveList(rr::PRIMITIVETYPE_TRIANGLES, numVertices, rr::DrawIndices(indices))));
}